

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O2

RefI31 * __thiscall wasm::Builder::makeRefI31(Builder *this,Expression *value,Shareability share)

{
  BasicHeapType BVar1;
  uintptr_t in_RAX;
  RefI31 *pRVar2;
  HeapType heapType;
  Type local_28;
  
  local_28.id = in_RAX;
  pRVar2 = MixedArena::alloc<wasm::RefI31>(&this->wasm->allocator);
  pRVar2->value = value;
  BVar1 = HeapType::getBasic((HeapType *)&HeapTypes::i31,share);
  heapType.id._4_4_ = 0;
  heapType.id._0_4_ = BVar1;
  Type::Type(&local_28,heapType,NonNullable,Inexact);
  (pRVar2->super_SpecificExpression<(wasm::Expression::Id)59>).super_Expression.type.id =
       local_28.id;
  ::wasm::RefI31::finalize();
  return pRVar2;
}

Assistant:

RefI31* makeRefI31(Expression* value, Shareability share = Unshared) {
    auto* ret = wasm.allocator.alloc<RefI31>();
    ret->value = value;
    ret->type = Type(HeapTypes::i31.getBasic(share), NonNullable);
    ret->finalize();
    return ret;
  }